

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool container_iterator_lower_bound
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,
                uint16_t *value_out,uint16_t val)

{
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  uint16_t *in_RCX;
  int *in_RDX;
  char in_SIL;
  run_container_t *in_RDI;
  ushort in_R8W;
  run_container_t *rc;
  array_container_t *ac;
  bitset_container_t *bc;
  container_t *in_stack_ffffffffffffffa8;
  array_container_t *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  uint16_t x;
  _Bool local_1;
  
  x = (uint16_t)((ulong)in_stack_ffffffffffffffc0 >> 0x30);
  uVar2 = (uint)in_R8W;
  uVar1 = container_maximum(in_stack_ffffffffffffffa8,'\0');
  if ((int)(uint)uVar1 < (int)uVar2) {
    local_1 = false;
  }
  else if (in_SIL == '\x01') {
    iVar3 = bitset_container_index_equalorlarger((bitset_container_t *)in_RDI,x);
    *in_RDX = iVar3;
    *in_RCX = (uint16_t)*in_RDX;
    local_1 = true;
  }
  else {
    uVar1 = (uint16_t)(uVar2 >> 0x10);
    if (in_SIL == '\x02') {
      iVar3 = array_container_index_equalorlarger(in_stack_ffffffffffffffb8,uVar1);
      *in_RDX = iVar3;
      *in_RCX = (&in_RDI->runs->value)[*in_RDX];
      local_1 = true;
    }
    else {
      iVar3 = run_container_index_equalorlarger(in_RDI,uVar1);
      *in_RDX = iVar3;
      if (in_R8W < in_RDI->runs[*in_RDX].value) {
        *in_RCX = in_RDI->runs[*in_RDX].value;
      }
      else {
        *in_RCX = in_R8W;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool container_iterator_lower_bound(const container_t *c, uint8_t typecode,
                                    roaring_container_iterator_t *it,
                                    uint16_t *value_out, uint16_t val) {
    if (val > container_maximum(c, typecode)) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index = bitset_container_index_equalorlarger(bc, val);
            *value_out = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index = array_container_index_equalorlarger(ac, val);
            *value_out = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            it->index = run_container_index_equalorlarger(rc, val);
            if (rc->runs[it->index].value <= val) {
                *value_out = val;
            } else {
                *value_out = rc->runs[it->index].value;
            }
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}